

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall helics::Input::handleCallback(Input *this,Time time)

{
  bool bVar1;
  char *pcVar2;
  TimeRepresentation<count_time<9,_long>_> __args_1;
  function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  *this_00;
  NamedPoint *__args;
  int __c;
  char *in_RSI;
  long in_RDI;
  TimeRepresentation<count_time<9,_long>_> val_8;
  bool val_7;
  NamedPoint val_6;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> val_5;
  vector<double,_std::allocator<double>_> val_4;
  complex<double> val_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val_2;
  long val_1;
  double val;
  Input *in_stack_fffffffffffffeb8;
  Input *in_stack_fffffffffffffec0;
  Input *in_stack_fffffffffffffec8;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffed0;
  
  bVar1 = isUpdated(in_stack_fffffffffffffeb8);
  if (bVar1) {
    pcVar2 = std::
             variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
             ::index((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                      *)(in_RDI + 0x108),in_RSI,__c);
    switch(pcVar2) {
    case (char *)0x0:
      getValue<double>(in_stack_fffffffffffffec0);
      std::
      get<std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  *)0x388f8e);
      std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>::operator()
                ((function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)> *)
                 in_stack_fffffffffffffec8,(double *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffed0);
      break;
    case (char *)0x1:
      getValue<long>(in_stack_fffffffffffffec0);
      std::
      get<std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  *)0x388fde);
      std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>::operator()
                ((function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)> *)
                 in_stack_fffffffffffffec8,(long *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffed0);
      break;
    case (char *)0x2:
    default:
      getValue<std::__cxx11::string>(in_stack_fffffffffffffec8);
      std::
      get<std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  *)0x389030);
      CLI::std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
                    *)in_stack_fffffffffffffec8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffec0,in_stack_fffffffffffffed0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffec0);
      break;
    case (char *)0x3:
      getValue<std::complex<double>>(in_stack_fffffffffffffec0);
      std::
      get<std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  *)0x3890c8);
      std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>::
      operator()((function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>
                  *)in_stack_fffffffffffffec8,(complex<double> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffed0);
      break;
    case (char *)0x4:
      getValue<std::vector<double,std::allocator<double>>>(in_stack_fffffffffffffec8);
      __args_1.internalTimeCode =
           (baseType)
           std::
           get<std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                     ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                       *)0x389118);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
      ::operator()((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
                    *)in_stack_fffffffffffffec8,
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0,__args_1);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)__args_1.internalTimeCode);
      break;
    case (char *)0x5:
      getValue<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                (in_stack_fffffffffffffec8);
      this_00 = std::
                get<std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                          ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                            *)0x3891a6);
      std::
      function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
      ::operator()(this_00,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                           in_stack_fffffffffffffec0,in_stack_fffffffffffffed0);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffed0.internalTimeCode);
      break;
    case (char *)0x6:
      getValue<helics::NamedPoint>(in_stack_fffffffffffffec8);
      __args = (NamedPoint *)
               std::
               get<std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                         ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                           *)0x389231);
      std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
      operator()((function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                  *)in_stack_fffffffffffffec8,__args,in_stack_fffffffffffffed0);
      NamedPoint::~NamedPoint((NamedPoint *)0x389265);
      break;
    case (char *)0x7:
      getValue<bool>(in_stack_fffffffffffffec0);
      std::
      get<std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  *)0x3892ae);
      std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>::operator()
                ((function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)> *)
                 in_stack_fffffffffffffec8,(bool *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffed0);
      break;
    case (char *)0x8:
      getValue<TimeRepresentation<count_time<9,long>>>(in_stack_fffffffffffffeb8);
      std::
      get<std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                ((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  *)0x3892ef);
      std::
      function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
      ::operator()((function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
                    *)in_stack_fffffffffffffec8,
                   (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffed0);
    }
  }
  return;
}

Assistant:

void Input::handleCallback(Time time)
{
    if (!isUpdated()) {
        return;
    }
    switch (value_callback.index()) {
        case double_loc: {
            auto val = getValue<double>();
            std::get<std::function<void(const double&, Time)>>(value_callback)(val, time);
        } break;
        case int_loc: {
            auto val = getValue<int64_t>();
            std::get<std::function<void(const int64_t&, Time)>>(value_callback)(val, time);
        } break;
        case string_loc:
        default: {
            auto val = getValue<std::string>();
            std::get<std::function<void(const std::string&, Time)>>(value_callback)(val, time);
        } break;
        case complex_loc: {
            auto val = getValue<std::complex<double>>();
            std::get<std::function<void(const std::complex<double>&, Time)>>(value_callback)(val,
                                                                                             time);
        } break;
        case vector_loc: {
            auto val = getValue<std::vector<double>>();
            std::get<std::function<void(const std::vector<double>&, Time)>>(value_callback)(val,
                                                                                            time);
        } break;
        case complex_vector_loc: {
            auto val = getValue<std::vector<std::complex<double>>>();
            std::get<std::function<void(const std::vector<std::complex<double>>&, Time)>>(
                value_callback)(val, time);
        } break;
        case named_point_loc: {
            auto val = getValue<NamedPoint>();
            std::get<std::function<void(const NamedPoint&, Time)>>(value_callback)(val, time);
        } break;
        case 7:  // bool loc
        {
            auto val = getValue<bool>();
            std::get<std::function<void(const bool&, Time)>>(value_callback)(val, time);
        } break;
        case 8:  // Time loc
        {
            auto val = getValue<Time>();
            std::get<std::function<void(const Time&, Time)>>(value_callback)(val, time);
        } break;
    }
}